

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *node;
  DisableStatementSyntax *pDVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000058;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000060;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  NamedLabelSyntax *in_stack_ffffffffffffffb0;
  NamedLabelSyntax *local_48;
  
  if (*(long *)(__fn + 0x18) == 0) {
    local_48 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_48 = deepClone<slang::syntax::NamedLabelSyntax>
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  node = deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000060,in_stack_00000058);
  TVar2 = parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0x5910f4);
  deepClone<slang::syntax::NameSyntax>((NameSyntax *)node,in_stack_ffffffffffffffa8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DisableStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::NameSyntax&,slang::parsing::Token>
                     (unaff_retaddr,(NamedLabelSyntax **)__fn,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__child_stack,
                      (Token *)local_48,(NameSyntax *)TVar2.info,TVar2._0_8_);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DisableStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DisableStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.disable.deepClone(alloc),
        *deepClone<NameSyntax>(*node.name, alloc),
        node.semi.deepClone(alloc)
    );
}